

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  int unaff_retaddr;
  longlong in_stack_00000190;
  int in_stack_000001b4;
  int in_stack_000001c4;
  longlong in_stack_000001d8;
  _func_vector<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_>_IBoard_ptr_longlong
  *in_stack_000001e0;
  int in_stack_000002a4;
  int in_stack_000002b4;
  allocator local_21;
  string local_20 [32];
  
  BoardTest<ttt::Board>();
  BoardTest<uttt::IBoard>();
  UtttHashTest();
  MCTSTest<ttt::Board,std::vector<mcts::MCTSResults,std::allocator<mcts::MCTSResults>>(&)(ttt::Board_const&,long_long)>
            ((_func_vector<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_>_Board_ptr_longlong
              *)in_stack_000001e0,in_stack_000001d8);
  MCTSTest<ttt::Board,std::vector<mcts::MCTSResults,std::allocator<mcts::MCTSResults>>(&)(ttt::Board_const&,long_long)>
            ((_func_vector<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_>_Board_ptr_longlong
              *)in_stack_000001e0,in_stack_000001d8);
  MCTSTest<ttt::Board,std::vector<mcts::MCTSResults,std::allocator<mcts::MCTSResults>>(&)(ttt::Board_const&,long_long)>
            ((_func_vector<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_>_Board_ptr_longlong
              *)in_stack_000001e0,in_stack_000001d8);
  MCTSTest<uttt::IBoard,std::vector<mcts::MCTSResults,std::allocator<mcts::MCTSResults>>(&)(uttt::IBoard_const&,long_long)>
            (in_stack_000001e0,in_stack_000001d8);
  MCTSTest<uttt::IBoard,std::vector<mcts::MCTSResults,std::allocator<mcts::MCTSResults>>(&)(uttt::IBoard_const&,long_long)>
            (in_stack_000001e0,in_stack_000001d8);
  MCTSTest<uttt::IBoard,std::vector<mcts::MCTSResults,std::allocator<mcts::MCTSResults>>(&)(uttt::IBoard_const&,long_long)>
            (in_stack_000001e0,in_stack_000001d8);
  ManagerTest<ttt::Board,mcts::RandomPlayout<ttt::Board>>();
  ManagerTest<uttt::IBoard,uttt::RandomPlayout>();
  CountTest<ttt::Board>(unaff_retaddr);
  CountTest<uttt::IBoard>(unaff_retaddr);
  CountBFS<ttt::Board>(in_stack_000001b4);
  CountBFS<uttt::IBoard>(in_stack_000001c4);
  BotTest<generic_bots::MinimaxBot<ttt::Board,minimax::ABeta<ttt::Board,minimax::Eval<ttt::Board>>>,ttt::Board>
            ();
  BotTest<generic_bots::MinimaxBot<uttt::IBoard,minimax::ABeta<uttt::IBoard,uttt::Eval1>>,uttt::IBoard>
            ();
  CountUniqueBoardPositions<ttt::Board>(in_stack_000002a4);
  CountUniqueBoardPositions<uttt::IBoard>(in_stack_000002b4);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_20,"/mnt/e/uttt_data",&local_21);
  ExplorerTest<uttt::IBoard,uttt::IBoardReader,uttt::IBoardWriter,24>((string *)0x1edfd3);
  std::__cxx11::string::~string(local_20);
  std::allocator<char>::~allocator((allocator<char> *)&local_21);
  ReaderWriterTest<uttt::IBoard,uttt::IBoardReader,uttt::IBoardWriter,24>(in_stack_00000190);
  return 0;
}

Assistant:

int main()
{
    BoardTest<ttt::Board>();
    BoardTest<uttt::IBoard>();

    UtttHashTest();

    MCTSTest<ttt::Board>(mcts::MCTS<ttt::Board>, 100000);
    MCTSTest<ttt::Board>(mcts::MCTS_parallel<ttt::Board>, 100000);
    MCTSTest<ttt::Board>(mcts::MCTS_cache<ttt::Board>, 100000);
    MCTSTest<uttt::IBoard>(mcts::MCTS<uttt::IBoard, uttt::RandomPlayout>, 100000);
    MCTSTest<uttt::IBoard>(mcts::MCTS_parallel<uttt::IBoard, uttt::RandomPlayout>, 100000);
    MCTSTest<uttt::IBoard>(mcts::MCTS_cache<uttt::IBoard, uttt::RandomPlayout>, 100000);

    ManagerTest<ttt::Board>();
    ManagerTest<uttt::IBoard, uttt::RandomPlayout>();

    CountTest<ttt::Board>(10);
    CountTest<uttt::IBoard>(10);
    CountBFS<ttt::Board>(10);
    CountBFS<uttt::IBoard>(10);

    BotTest<generic_bots::MinimaxBot<ttt::Board, minimax::ABeta<ttt::Board>>, ttt::Board>();
    BotTest<generic_bots::MinimaxBot<uttt::IBoard, minimax::ABeta<uttt::IBoard, uttt::Eval1>>, uttt::IBoard>();

    CountUniqueBoardPositions<ttt::Board>(20);
    CountUniqueBoardPositions<uttt::IBoard>(20);

    ExplorerTest<uttt::IBoard, uttt::IBoardReader, uttt::IBoardWriter, uttt::IBoardSize>("/mnt/e/uttt_data");
    ReaderWriterTest<uttt::IBoard, uttt::IBoardReader, uttt::IBoardWriter, uttt::IBoardSize>(10000000);
}